

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall nuraft::buffer_serializer::put_u32(buffer_serializer *this,uint32_t val)

{
  bool bVar1;
  byte bVar2;
  overflow_error *this_00;
  byte *pbVar5;
  undefined4 in_ESI;
  buffer_serializer *in_RDI;
  uint8_t *ptr;
  buffer_serializer *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  byte bVar3;
  byte bVar4;
  
  bVar1 = is_valid(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar5 = nuraft::buffer::data_begin(in_RDI->buf_);
  pbVar5 = pbVar5 + in_RDI->pos_;
  bVar2 = (byte)((uint)in_ESI >> 8);
  bVar3 = (byte)((uint)in_ESI >> 0x10);
  bVar4 = (byte)((uint)in_ESI >> 0x18);
  if (in_RDI->endian_ == LITTLE) {
    *pbVar5 = (byte)in_ESI;
    pbVar5[1] = bVar2;
    pbVar5[2] = bVar3;
    pbVar5[3] = bVar4;
  }
  else {
    pbVar5[3] = (byte)in_ESI;
    pbVar5[2] = bVar2;
    pbVar5[1] = bVar3;
    *pbVar5 = bVar4;
  }
  pos(in_RDI);
  pos((buffer_serializer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void buffer_serializer::put_u32(uint32_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put32l(val, ptr); }
    else                    { put32b(val, ptr); }
    pos( pos() + sizeof(val) );
}